

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DelayImpDirWrapper.cpp
# Opt level: O2

QString * __thiscall
DelayImpEntryWrapper::getName(QString *__return_storage_ptr__,DelayImpEntryWrapper *this)

{
  int iVar1;
  undefined4 extraout_var;
  char *ch;
  
  iVar1 = (*(this->super_ImportBaseEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
            super_ExeElementWrapper.super_AbstractByteBuffer._vptr_AbstractByteBuffer[0x31])(this);
  ch = "";
  if ((char *)CONCAT44(extraout_var,iVar1) != (char *)0x0) {
    ch = (char *)CONCAT44(extraout_var,iVar1);
  }
  QString::QString(__return_storage_ptr__,ch);
  return __return_storage_ptr__;
}

Assistant:

QString DelayImpEntryWrapper::getName()
{
    char* name = getLibraryName();
    if (!name) return "";
    return QString(name);
}